

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_send_file_body(mg_connection *conn,char *path)

{
  int iVar1;
  mg_file *in_RCX;
  int in_R8D;
  mg_file file;
  mg_file local_48;
  
  local_48.stat.is_directory = 0;
  local_48.stat.is_gzipped = 0;
  local_48.stat.location = 0;
  local_48.stat._28_4_ = 0;
  local_48.stat.size = 0;
  local_48.stat.last_modified = 0;
  local_48.access.fp = (FILE *)0x0;
  iVar1 = mg_fopen((mg_connection *)path,(char *)0x1,(int)&local_48,in_RCX);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    fclose_on_exec(&local_48.access,conn);
    send_file_data(conn,&local_48,0,0x7fffffffffffffff,in_R8D);
    iVar1 = 0;
    if ((FILE *)local_48.access.fp != (FILE *)0x0) {
      fclose((FILE *)local_48.access.fp);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

CIVETWEB_API int
mg_send_file_body(struct mg_connection *conn, const char *path)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;
	if (!mg_fopen(conn, path, MG_FOPEN_MODE_READ, &file)) {
		return -1;
	}
	fclose_on_exec(&file.access, conn);
	send_file_data(conn, &file, 0, INT64_MAX, 0); /* send static file */
	(void)mg_fclose(&file.access); /* Ignore errors for readonly files */
	return 0;                      /* >= 0 for OK */
}